

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

char * TextJoin(char **textList,int count,char *delimiter)

{
  char *__src;
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  char *__dest;
  
  __dest = TextJoin::text;
  uVar5 = 0;
  memset(TextJoin::text,0,0x400);
  if ((delimiter != (char *)0x0) && (*delimiter != '\0')) {
    uVar5 = 0;
    do {
      lVar3 = uVar5 + 1;
      uVar5 = uVar5 + 1;
    } while (delimiter[lVar3] != '\0');
  }
  if (0 < count) {
    uVar4 = 0;
    iVar7 = 0;
    do {
      __src = textList[uVar4];
      lVar3 = 0;
      if ((__src != (char *)0x0) && (lVar3 = 0, *__src != '\0')) {
        lVar3 = 0;
        do {
          lVar2 = lVar3 + 1;
          lVar3 = lVar3 + 1;
        } while (__src[lVar2] != '\0');
      }
      iVar1 = (int)lVar3;
      iVar6 = iVar1 + iVar7;
      if (iVar6 < 0x400) {
        memcpy(__dest,__src,(long)iVar1);
        __dest = __dest + iVar1;
        iVar7 = iVar6;
        if ((0 < (int)uVar5) && ((long)uVar4 < (long)(count + -1))) {
          memcpy(__dest,delimiter,uVar5 & 0xffffffff);
          iVar7 = iVar6 + (int)uVar5;
          __dest = __dest + (uVar5 & 0xffffffff);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)count);
  }
  return TextJoin::text;
}

Assistant:

const char *TextJoin(const char **textList, int count, const char *delimiter)
{
    static char text[MAX_TEXT_BUFFER_LENGTH] = { 0 };
    memset(text, 0, MAX_TEXT_BUFFER_LENGTH);
    char *textPtr = text;

    int totalLength = 0;
    int delimiterLen = TextLength(delimiter);

    for (int i = 0; i < count; i++)
    {
        int textLength = TextLength(textList[i]);

        // Make sure joined text could fit inside MAX_TEXT_BUFFER_LENGTH
        if ((totalLength + textLength) < MAX_TEXT_BUFFER_LENGTH)
        {
            memcpy(textPtr, textList[i], textLength);
            totalLength += textLength;
            textPtr += textLength;

            if ((delimiterLen > 0) && (i < (count - 1)))
            {
                memcpy(textPtr, delimiter, delimiterLen);
                totalLength += delimiterLen;
                textPtr += delimiterLen;
            }
        }
    }

    return text;
}